

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O2

qint64 __thiscall
QNetworkReplyFileImpl::readData(QNetworkReplyFileImpl *this,char *data,qint64 maxlen)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(this + 8);
  lVar6 = -1;
  if (*(char *)(lVar5 + 0x22c) == '\x01') {
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)(lVar5 + 0x238));
    if (bVar1) {
      cVar2 = QIODevice::isOpen();
      if (cVar2 != '\0') {
        lVar3 = QIODevice::read(*(char **)(lVar5 + 0x240),(longlong)data);
        lVar4 = (**(code **)(*(long *)this + 0xa0))(this);
        if (lVar4 == 0) {
          (**(code **)(**(long **)(lVar5 + 0x240) + 0x70))();
        }
        if (lVar3 == 0) {
          lVar5 = (**(code **)(*(long *)this + 0xa0))(this);
          if (lVar5 == 0) goto LAB_0018e81a;
        }
        QVariant::QVariant(&local_50,200);
        QNetworkReply::setAttribute((QNetworkReply *)this,HttpStatusCodeAttribute,&local_50);
        QVariant::~QVariant(&local_50);
        QVar7.m_data = "OK";
        QVar7.m_size = 2;
        QVariant::QVariant(&local_50,QVar7);
        QNetworkReply::setAttribute((QNetworkReply *)this,HttpReasonPhraseAttribute,&local_50);
        QVariant::~QVariant(&local_50);
        lVar6 = lVar3;
      }
    }
  }
LAB_0018e81a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar6;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkReplyFileImpl::readData(char *data, qint64 maxlen)
{
    Q_D(QNetworkReplyFileImpl);
    if (!d->isFinished || !d->realFile || !d->realFile->isOpen())
        return -1;
    qint64 ret = d->realFile->read(data, maxlen);
    if (bytesAvailable() == 0)
        d->realFile->close();
    if (ret == 0 && bytesAvailable() == 0)
        return -1;
    else {
        setAttribute(QNetworkRequest::HttpStatusCodeAttribute, 200);
        setAttribute(QNetworkRequest::HttpReasonPhraseAttribute, "OK"_L1);
        return ret;
    }
}